

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O2

void __thiscall t_d_generator::emit_doc(t_d_generator *this,t_doc *doc,ostream *out)

{
  int *piVar1;
  ostream *poVar2;
  
  if (doc->has_doc_ == true) {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"/**");
    std::endl<char,std::char_traits<char>>(poVar2);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar2 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar2,(string *)&doc->doc_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"*/");
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  return;
}

Assistant:

void emit_doc(t_doc *doc, std::ostream& out) {
    if (!doc->has_doc()) {
      return;
    }
    indent(out) << "/**" << std::endl;
    indent_up();
    // No endl -- comments reliably have a newline at the end.
    // This is true even for stuff like:
    //     /** method infos */ void foo(/** huh?*/ 1: i64 stuff)
    indent(out) << doc->get_doc();
    indent_down();
    indent(out) << "*/" << std::endl;
  }